

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey.c
# Opt level: O2

string * med3func(string *a,string *b,string *c,int depth)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  string *ppuVar4;
  
  bVar1 = (*a)[depth];
  bVar2 = (*b)[depth];
  if (bVar1 == bVar2) {
    return a;
  }
  bVar3 = (*c)[depth];
  ppuVar4 = c;
  if (bVar3 != bVar2 && bVar3 != bVar1) {
    ppuVar4 = b;
    if (bVar1 < bVar2) {
      if (bVar3 <= bVar2) {
        if (bVar3 <= bVar1) {
          return a;
        }
        return c;
      }
    }
    else if ((bVar2 <= bVar3) && (ppuVar4 = c, bVar1 < bVar3)) {
      ppuVar4 = a;
    }
  }
  return ppuVar4;
}

Assistant:

static string *med3func(string *a, string *b, string *c, int depth)
{   int va, vb, vc;
    if ((va=ptr2char(a)) == (vb=ptr2char(b)))
        return a;
    if ((vc=ptr2char(c)) == va || vc == vb)
        return c;       
    return va < vb ?
          (vb < vc ? b : (va < vc ? c : a ) )
        : (vb > vc ? b : (va < vc ? a : c ) );
}